

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O1

void __thiscall
SuiteFileStoreTests::TestresetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoException::
RunImpl(TestresetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoException *this)

{
  TestDetails *details;
  resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper fixtureHelper;
  resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper rStack_1c8;
  
  details = &(this->super_Test).m_details;
  resetBeforeAndAfterWithTestFileManager::resetBeforeAndAfterWithTestFileManager
            (&rStack_1c8.super_resetBeforeAndAfterWithTestFileManager);
  rStack_1c8.m_details = details;
  UnitTest::
  ExecuteTest<SuiteFileStoreTests::resetBeforeAndAfterWithTestFileManagerReset_DeleteFileStartup_NoExceptionHelper>
            (&rStack_1c8,details);
  fileStoreFixture::~fileStoreFixture((fileStoreFixture *)&rStack_1c8);
  return;
}

Assistant:

TEST_FIXTURE(resetBeforeAndAfterWithTestFileManager, Reset_DeleteFileStartup_NoException) {
  try {
    object->reset();
  } catch (Exception& e) {
    CHECK(false);
    throw e;
  }
}